

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::retry_web_seed
          (torrent *this,peer_connection *p,
          optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> retry)

{
  list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> *plVar1;
  time_point32 tVar2;
  int iVar3;
  _Storage<std::chrono::duration<int,_std::ratio<1L,_1L>_>,_true> _Var4;
  undefined4 extraout_var;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  
  plVar1 = &this->m_web_seeds;
  p_Var5 = (_List_node_base *)&p->super_peer_connection_interface;
  p_Var6 = (_List_node_base *)plVar1;
  if (p == (peer_connection *)0x0) {
    p_Var5 = (_List_node_base *)0x0;
  }
  do {
    p_Var6 = (((_List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var6 == (_List_node_base *)plVar1) {
      return;
    }
  } while (p_Var6[9]._M_next != p_Var5);
  if ((*(undefined1 *)((long)&p_Var6[0xb]._M_next + 2) == '\0') &&
     (*(undefined1 *)((long)&p_Var6[0xb]._M_next + 6) == '\0')) {
    tVar2 = time_now32();
    iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x2e])();
    _Var4 = (_Storage<std::chrono::duration<int,_std::ratio<1L,_1L>_>,_true>)
            session_settings::get_int((session_settings *)CONCAT44(extraout_var,iVar3),0x400d);
    if (((ulong)retry.
                super__Optional_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>,_true,_true>.
                _M_payload.
                super__Optional_payload_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> >>
         0x20 & 1) != 0) {
      _Var4 = retry.
              super__Optional_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>,_true,_true>.
              _M_payload.
              super__Optional_payload_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>_>.
              _M_payload;
    }
    *(int *)((long)&p_Var6[6]._M_prev + 4) = (int)_Var4 + (int)tVar2.__d.__r;
  }
  return;
}

Assistant:

void torrent::retry_web_seed(peer_connection* p, std::optional<seconds32> const retry)
	{
		TORRENT_ASSERT(is_single_thread());
		auto const i = std::find_if(m_web_seeds.begin(), m_web_seeds.end()
			, [p] (web_seed_t const& ws) { return ws.peer_info.connection == p; });

		TORRENT_ASSERT(i != m_web_seeds.end());
		if (i == m_web_seeds.end()) return;
		if (i->removed || i->disabled) return;
		i->retry = aux::time_now32() + retry.value_or(seconds32(
			settings().get_int(settings_pack::urlseed_wait_retry)));
	}